

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O2

bool __thiscall Button::onPointerEvent(Button *this,PointerEvent *e)

{
  Type TVar1;
  bool bVar2;
  bool bVar3;
  State state;
  rect2d local_28;
  
  TVar1 = (e->super_Event).m_type;
  bVar3 = true;
  if (TVar1 == PointerMove) {
    local_28.tl = *(vec2 *)&(this->super_RectangleNodeBase).super_Node.field_0x34;
    local_28.br.x = *(float *)&(this->super_RectangleNodeBase).field_0x3c;
    local_28.br.y = *(float *)&(this->super_RectangleNodeBase).field_0x40;
    bVar2 = rengine::rect2d::contains(&local_28,*(vec2 *)&(e->super_Event).field_0xc);
    if (bVar2) {
      this->m_surface->m_pointerEventReceiver = (Node *)this;
      state = HoveredState;
    }
    else {
      this->m_surface->m_pointerEventReceiver = (Node *)0x0;
      bVar3 = false;
      state = DefaultState;
    }
  }
  else {
    if (TVar1 == PointerUp) {
      setState(this,HoveredState);
      rengine::Signal<>::emit(&onClicked,(SignalEmitter *)this);
      return true;
    }
    if (TVar1 != PointerDown) {
      return true;
    }
    state = PressedState;
  }
  setState(this,state);
  return bVar3;
}

Assistant:

bool Button::onPointerEvent(PointerEvent *e)
{
    if (e->type() == Event::PointerDown) {
        setState(PressedState);
    } else if (e->type() == Event::PointerUp) {
        setState(HoveredState);
        onClicked.emit(this);
    } else if (e->type() == Event::PointerMove) {
        if (geometry().contains(e->position())) {
            m_surface->setPointerEventReceiver(this);
            setState(HoveredState);
        } else {
            m_surface->setPointerEventReceiver(nullptr);
            setState(DefaultState);
            return false;
        }
    }

    return true;
}